

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParamConstraint.hpp
# Opt level: O0

bool __thiscall
OpenMD::
OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>,OpenMD::EqualIgnoreCaseConstraint>
::operator()(OrParamConstraint<OpenMD::OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint>,_OpenMD::EqualIgnoreCaseConstraint>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  bool bVar1;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> *in_RSI;
  bool local_91;
  string local_68 [16];
  string *in_stack_ffffffffffffffa8;
  EqualIgnoreCaseConstraint *in_stack_ffffffffffffffb0;
  string local_38 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,_OpenMD::EqualIgnoreCaseConstraint> *this_00;
  
  this_00 = in_RSI;
  std::__cxx11::string::string(local_38,(string *)in_RSI);
  bVar1 = OrParamConstraint<OpenMD::EqualIgnoreCaseConstraint,OpenMD::EqualIgnoreCaseConstraint>::
          operator()(this_00,in_stack_ffffffffffffffe0);
  local_91 = true;
  if (!bVar1) {
    std::__cxx11::string::string(local_68,(string *)in_RSI);
    local_91 = EqualIgnoreCaseConstraint::operator()
                         (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::~string(local_38);
  return local_91;
}

Assistant:

bool operator()(DataType data) const {
      return cons1_(data) || cons2_(data);
    }